

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

int lys_set_enabled(lys_module *module)

{
  byte *pbVar1;
  uint16_t *puVar2;
  lys_module *node;
  lys_node *plVar3;
  long lVar4;
  int iVar5;
  ly_set *mods;
  ly_set *set;
  ly_set *set_00;
  lys_node *leafref;
  lys_node *plVar6;
  lys_node *plVar7;
  byte bVar8;
  ushort uVar9;
  LYS_NODE LVar10;
  char *format;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ly_ctx *ctx;
  lys_ident *der;
  ulong uVar15;
  char *pcVar16;
  bool bVar17;
  uint local_34 [2];
  uint s;
  
  if (module == (lys_module *)0x0) {
    format = "Invalid arguments (%s()).";
    pcVar16 = "lys_set_enabled";
    ctx = (ly_ctx *)0x0;
LAB_0010d611:
    ly_log(ctx,LY_LLERR,LY_EINVAL,format,pcVar16);
    iVar5 = 1;
  }
  else {
    iVar5 = 0;
    if ((module->field_0x40 & 0x40) != 0) {
      ctx = module->ctx;
      if ((ulong)ctx->internal_module_count != 0) {
        uVar11 = 0;
        do {
          if ((ctx->models).list[uVar11] == module) {
            pcVar16 = module->name;
            format = "Internal module \"%s\" cannot be removed.";
            goto LAB_0010d611;
          }
          uVar11 = uVar11 + 1;
        } while (ctx->internal_module_count != uVar11);
      }
      mods = ly_set_new();
      set = ly_set_new();
      lys_set_enabled_(mods,module);
LAB_0010d2bc:
      if ((int)(uint)ctx->internal_module_count < (ctx->models).used) {
        uVar11 = (ulong)ctx->internal_module_count;
        do {
          node = (ctx->models).list[uVar11];
          if (((node->field_0x40 & 0x40) != 0) && (iVar5 = ly_set_contains(set,node), iVar5 == -1))
          {
            uVar13 = (ulong)node->imp_size;
            if (uVar13 != 0) {
              lVar14 = 0;
              do {
                if ((*(byte *)(*(long *)(node->imp->rev + lVar14 + -0x10) + 0x40) & 0x40) != 0)
                goto LAB_0010d369;
                lVar14 = lVar14 + 0x38;
              } while (uVar13 * 0x38 - lVar14 != 0);
              if (uVar13 != 0) {
                uVar12 = 0;
                do {
                  if ((ulong)mods->number != 0) {
                    uVar15 = 0;
                    do {
                      if (node->imp[uVar12].module == (lys_module *)(mods->set).s[uVar15]) {
                        node->field_0x40 = node->field_0x40 & 0xbf;
                        ly_set_add(mods,node,0);
                        if (node->inc_size != '\0') {
                          lVar14 = 0;
                          uVar11 = 0;
                          do {
                            pbVar1 = (byte *)(*(long *)(node->inc->rev + lVar14 + -8) + 0x40);
                            *pbVar1 = *pbVar1 & 0xbf;
                            uVar11 = uVar11 + 1;
                            lVar14 = lVar14 + 0x30;
                          } while (uVar11 < node->inc_size);
                        }
                        goto LAB_0010d2bc;
                      }
                      uVar15 = uVar15 + 1;
                    } while (mods->number != uVar15);
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar13);
              }
            }
            ly_set_add(set,node,0);
          }
LAB_0010d369:
          uVar11 = uVar11 + 1;
        } while ((int)uVar11 < (ctx->models).used);
      }
      if (mods->number != 0) {
        uVar11 = 0;
        do {
          plVar3 = (mods->set).s[uVar11];
          if ((((ulong)plVar3->parent & 0x80) != 0) &&
             (uVar9 = *(ushort *)&plVar3->child, uVar9 != 0)) {
            pcVar16 = plVar3[1].dsc;
            uVar13 = 0;
            do {
              if (pcVar16[uVar13 * 0x48 + 0x1f] != '\0') {
                der = (lys_ident *)(pcVar16 + uVar13 * 0x48);
                uVar12 = 0;
                do {
                  resolve_identity_backlink_update(der,der->base[uVar12]);
                  uVar12 = uVar12 + 1;
                  pcVar16 = plVar3[1].dsc;
                  der = (lys_ident *)(pcVar16 + uVar13 * 0x48);
                } while (uVar12 < der->base_size);
                uVar9 = *(ushort *)&plVar3->child;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < uVar9);
          }
          bVar8 = *(byte *)((long)&plVar3->child + 4);
          if (bVar8 != 0) {
            pcVar16 = plVar3[1].ref;
            uVar13 = 0;
            do {
              lVar14 = uVar13 * 0x40;
              if (pcVar16[lVar14 + 0x1b] != '\0') {
                uVar12 = 0;
                do {
                  resolve_iffeature_getsizes
                            ((lys_iffeature *)(*(long *)(pcVar16 + lVar14 + 0x28) + uVar12 * 0x20),
                             (uint *)0x0,local_34);
                  while (bVar17 = local_34[0] != 0, local_34[0] = local_34[0] - 1, bVar17) {
                    pcVar16 = plVar3[1].ref;
                    lVar4 = *(long *)(*(long *)(*(long *)(pcVar16 + lVar14 + 0x28) + 0x10 +
                                               uVar12 * 0x20) + (ulong)local_34[0] * 8);
                    set_00 = *(ly_set **)(lVar4 + 0x38);
                    if (set_00 == (ly_set *)0x0) {
                      set_00 = ly_set_new();
                      *(ly_set **)(lVar4 + 0x38) = set_00;
                      pcVar16 = plVar3[1].ref;
                    }
                    ly_set_add(set_00,pcVar16 + lVar14,1);
                  }
                  uVar12 = uVar12 + 1;
                  pcVar16 = plVar3[1].ref;
                } while (uVar12 < (byte)pcVar16[lVar14 + 0x1b]);
                bVar8 = *(byte *)((long)&plVar3->child + 4);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < bVar8);
          }
          plVar6 = *(lys_node **)&plVar3[1].nodetype;
          if (*(lys_node **)&plVar3[1].nodetype != (lys_node *)0x0) {
LAB_0010d51e:
            leafref = plVar6;
            LVar10 = leafref->nodetype;
            if (LVar10 != LYS_GROUPING) goto code_r0x0010d52c;
            goto LAB_0010d566;
          }
LAB_0010d59f:
          uVar11 = uVar11 + 1;
          uVar13 = (ulong)mods->number;
        } while (uVar11 < uVar13);
        if (mods->number != 0) {
          uVar11 = 0;
          do {
            if ((((lys_module *)(mods->set).s[uVar11])->field_0x40 & 0x80) != 0) {
              lys_sub_module_apply_devs_augs((lys_module *)(mods->set).s[uVar11]);
              uVar13 = (ulong)mods->number;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar13);
        }
      }
      iVar5 = 0;
      ly_set_free(mods);
      ly_set_free(set);
      puVar2 = &(ctx->models).module_set_id;
      *puVar2 = *puVar2 + 1;
    }
  }
  return iVar5;
code_r0x0010d52c:
  if (((LVar10 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) && (*(int *)&leafref[1].ref == 9)) {
    lys_leaf_add_leafref_target(*(lys_node_leaf **)&leafref[1].nodetype,leafref);
    LVar10 = leafref->nodetype;
  }
  plVar6 = leafref->child;
  if (leafref->child == (lys_node *)0x0 ||
      (LVar10 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
LAB_0010d566:
    if (leafref == *(lys_node **)&plVar3[1].nodetype) goto LAB_0010d59f;
    while (plVar6 = leafref->next, leafref->next == (lys_node *)0x0) {
      leafref = lys_parent(leafref);
      plVar6 = lys_parent(leafref);
      plVar7 = lys_parent(*(lys_node **)&plVar3[1].nodetype);
      if (plVar6 == plVar7) goto LAB_0010d59f;
    }
  }
  goto LAB_0010d51e;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v, w;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    for (w = 0; w < mod->inc_size; w++) {
                        mod->inc[w].submodule->disabled = 0;
                    }
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        if (((struct lys_module *)mods->set.g[v])->implemented) {
            lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
        }
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}